

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

BFunc<6UL> * __thiscall GF2::BFunc<6UL>::Rand(BFunc<6UL> *this)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong uVar24;
  ulong uVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  WW<64UL> w;
  long local_68;
  long local_58;
  ulong local_18;
  
  local_18 = 0;
  Env::RandMem(&local_18,8);
  lVar1 = 0;
  auVar17 = _DAT_0013d050;
  auVar18 = _DAT_0013d080;
  auVar19 = _DAT_0013d090;
  auVar20 = _DAT_0013d0a0;
  auVar21 = _DAT_0013d0b0;
  auVar22 = _DAT_0013d010;
  auVar5 = _DAT_0013d060;
  auVar16 = _DAT_0013d070;
  do {
    auVar3._0_8_ = auVar22._8_8_;
    auVar3._8_4_ = auVar22._8_4_;
    auVar3._12_4_ = auVar22._12_4_;
    auVar8._0_8_ = auVar21._8_8_;
    auVar8._8_4_ = auVar21._8_4_;
    auVar8._12_4_ = auVar21._12_4_;
    auVar9._0_8_ = auVar20._8_8_;
    auVar9._8_4_ = auVar20._8_4_;
    auVar9._12_4_ = auVar20._12_4_;
    auVar10._0_8_ = auVar19._8_8_;
    auVar10._8_4_ = auVar19._8_4_;
    auVar10._12_4_ = auVar19._12_4_;
    auVar11._0_8_ = auVar18._8_8_;
    auVar11._8_4_ = auVar18._8_4_;
    auVar11._12_4_ = auVar18._12_4_;
    auVar12._0_8_ = auVar16._8_8_;
    auVar12._8_4_ = auVar16._8_4_;
    auVar12._12_4_ = auVar16._12_4_;
    auVar13._0_8_ = auVar5._8_8_;
    auVar13._8_4_ = auVar5._8_4_;
    auVar13._12_4_ = auVar5._12_4_;
    auVar14._0_8_ = auVar17._8_8_;
    auVar14._8_4_ = auVar17._8_4_;
    auVar14._12_4_ = auVar17._12_4_;
    local_68 = auVar16._0_8_;
    local_58 = auVar5._0_8_;
    uVar2 = 1L << auVar21._0_8_ & local_18;
    uVar7 = 1L << auVar8._8_8_ & local_18;
    uVar24 = 1L << auVar22._0_8_ & local_18;
    uVar31 = 1L << auVar3._8_8_ & local_18;
    auVar25._0_4_ = -(uint)((int)uVar24 == 0);
    auVar25._4_4_ = -(uint)((int)(uVar24 >> 0x20) == 0);
    auVar25._8_4_ = -(uint)((int)uVar31 == 0);
    auVar25._12_4_ = -(uint)((int)(uVar31 >> 0x20) == 0);
    auVar15._4_4_ = auVar25._0_4_;
    auVar15._0_4_ = auVar25._4_4_;
    auVar15._8_4_ = auVar25._12_4_;
    auVar15._12_4_ = auVar25._8_4_;
    auVar30._0_4_ = -(uint)((int)uVar2 == 0);
    auVar30._4_4_ = -(uint)((int)(uVar2 >> 0x20) == 0);
    auVar30._8_4_ = -(uint)((int)uVar7 == 0);
    auVar30._12_4_ = -(uint)((int)(uVar7 >> 0x20) == 0);
    auVar26._4_4_ = auVar30._0_4_;
    auVar26._0_4_ = auVar30._4_4_;
    auVar26._8_4_ = auVar30._12_4_;
    auVar26._12_4_ = auVar30._8_4_;
    uVar24 = 1L << auVar19._0_8_ & local_18;
    uVar31 = 1L << auVar10._8_8_ & local_18;
    uVar2 = 1L << auVar20._0_8_ & local_18;
    uVar7 = 1L << auVar9._8_8_ & local_18;
    auVar16 = packssdw(auVar15 & auVar25,auVar26 & auVar30);
    auVar32._0_4_ = -(uint)((int)uVar2 == 0);
    auVar32._4_4_ = -(uint)((int)(uVar2 >> 0x20) == 0);
    auVar32._8_4_ = -(uint)((int)uVar7 == 0);
    auVar32._12_4_ = -(uint)((int)(uVar7 >> 0x20) == 0);
    auVar4._4_4_ = auVar32._0_4_;
    auVar4._0_4_ = auVar32._4_4_;
    auVar4._8_4_ = auVar32._12_4_;
    auVar4._12_4_ = auVar32._8_4_;
    auVar35._0_4_ = -(uint)((int)uVar24 == 0);
    auVar35._4_4_ = -(uint)((int)(uVar24 >> 0x20) == 0);
    auVar35._8_4_ = -(uint)((int)uVar31 == 0);
    auVar35._12_4_ = -(uint)((int)(uVar31 >> 0x20) == 0);
    auVar27._4_4_ = auVar35._0_4_;
    auVar27._0_4_ = auVar35._4_4_;
    auVar27._8_4_ = auVar35._12_4_;
    auVar27._12_4_ = auVar35._8_4_;
    auVar5 = packssdw(auVar4 & auVar32,auVar27 & auVar35);
    uVar2 = 1L << local_68 & local_18;
    uVar7 = 1L << auVar12._8_8_ & local_18;
    uVar24 = 1L << auVar18._0_8_ & local_18;
    uVar31 = 1L << auVar11._8_8_ & local_18;
    auVar36._8_4_ = 0xffffffff;
    auVar36._0_8_ = 0xffffffffffffffff;
    auVar36._12_4_ = 0xffffffff;
    auVar16 = packssdw(auVar16 ^ auVar36,auVar5 ^ auVar36);
    auVar38._0_4_ = -(uint)((int)uVar24 == 0);
    auVar38._4_4_ = -(uint)((int)(uVar24 >> 0x20) == 0);
    auVar38._8_4_ = -(uint)((int)uVar31 == 0);
    auVar38._12_4_ = -(uint)((int)(uVar31 >> 0x20) == 0);
    auVar6._4_4_ = auVar38._0_4_;
    auVar6._0_4_ = auVar38._4_4_;
    auVar6._8_4_ = auVar38._12_4_;
    auVar6._12_4_ = auVar38._8_4_;
    auVar34._0_4_ = -(uint)((int)uVar2 == 0);
    auVar34._4_4_ = -(uint)((int)(uVar2 >> 0x20) == 0);
    auVar34._8_4_ = -(uint)((int)uVar7 == 0);
    auVar34._12_4_ = -(uint)((int)(uVar7 >> 0x20) == 0);
    auVar28._4_4_ = auVar34._0_4_;
    auVar28._0_4_ = auVar34._4_4_;
    auVar28._8_4_ = auVar34._12_4_;
    auVar28._12_4_ = auVar34._8_4_;
    uVar2 = 1L << auVar17._0_8_ & local_18;
    uVar7 = 1L << auVar14._8_8_ & local_18;
    uVar24 = 1L << local_58 & local_18;
    uVar31 = 1L << auVar13._8_8_ & local_18;
    auVar5 = packssdw(auVar6 & auVar38,auVar28 & auVar34);
    auVar37._0_4_ = -(uint)((int)uVar24 == 0);
    auVar37._4_4_ = -(uint)((int)(uVar24 >> 0x20) == 0);
    auVar37._8_4_ = -(uint)((int)uVar31 == 0);
    auVar37._12_4_ = -(uint)((int)(uVar31 >> 0x20) == 0);
    auVar29._4_4_ = auVar37._0_4_;
    auVar29._0_4_ = auVar37._4_4_;
    auVar29._8_4_ = auVar37._12_4_;
    auVar29._12_4_ = auVar37._8_4_;
    auVar23._0_4_ = -(uint)((int)uVar2 == 0);
    auVar23._4_4_ = -(uint)((int)(uVar2 >> 0x20) == 0);
    auVar23._8_4_ = -(uint)((int)uVar7 == 0);
    auVar23._12_4_ = -(uint)((int)(uVar7 >> 0x20) == 0);
    auVar33._4_4_ = auVar23._0_4_;
    auVar33._0_4_ = auVar23._4_4_;
    auVar33._8_4_ = auVar23._12_4_;
    auVar33._12_4_ = auVar23._8_4_;
    auVar30 = packssdw(auVar29 & auVar37,auVar33 & auVar23);
    auVar5 = packssdw(auVar5 ^ auVar36,auVar30 ^ auVar36);
    auVar5 = packsswb(auVar16,auVar5);
    *(undefined1 (*) [16])((this->super_Func<6UL,_bool>)._vals + lVar1) = auVar5 & _DAT_0013d0c0;
    lVar1 = lVar1 + 0x10;
    auVar22._0_8_ = auVar22._0_8_ + 0x10;
    auVar22._8_8_ = auVar3._0_8_ + 0x10;
    auVar21._0_8_ = auVar21._0_8_ + 0x10;
    auVar21._8_8_ = auVar8._0_8_ + 0x10;
    auVar20._0_8_ = auVar20._0_8_ + 0x10;
    auVar20._8_8_ = auVar9._0_8_ + 0x10;
    auVar19._0_8_ = auVar19._0_8_ + 0x10;
    auVar19._8_8_ = auVar10._0_8_ + 0x10;
    auVar18._0_8_ = auVar18._0_8_ + 0x10;
    auVar18._8_8_ = auVar11._0_8_ + 0x10;
    auVar16._0_8_ = local_68 + 0x10;
    auVar16._8_8_ = auVar12._0_8_ + 0x10;
    auVar5._0_8_ = local_58 + 0x10;
    auVar5._8_8_ = auVar13._0_8_ + 0x10;
    auVar17._0_8_ = auVar17._0_8_ + 0x10;
    auVar17._8_8_ = auVar14._0_8_ + 0x10;
  } while (lVar1 != 0x40);
  return this;
}

Assistant:

BFunc& Rand()
	{
		WW<_size> w;
		w.Rand();
		for (word x = 0; x < _size; x++)
			Set(x, w[x]);
		return *this;
	}